

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_group.cpp
# Opt level: O1

void __thiscall
duckdb::RowGroup::TemplatedScan<(duckdb::TableScanType)2>
          (RowGroup *this,TransactionData transaction,CollectionScanState *state,DataChunk *result)

{
  double *pdVar1;
  TableScanState *pTVar2;
  idx_t iVar3;
  BlockManager *pBVar4;
  BufferManager *pBVar5;
  size_type __n;
  UndoBufferEntry *pUVar6;
  idx_t iVar7;
  _Head_base<0UL,_duckdb::ColumnScanState_*,_false> _Var8;
  data_ptr_t pdVar9;
  long lVar10;
  undefined8 uVar11;
  bool bVar12;
  FilterPropagateResult FVar13;
  int iVar14;
  const_reference pvVar15;
  ColumnData *pCVar16;
  ulong uVar17;
  reference pvVar18;
  const_reference pvVar19;
  reference pvVar20;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var21;
  const_iterator __begin5;
  pointer pSVar22;
  size_type __n_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var23;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var24;
  long lVar25;
  size_type sVar26;
  pointer pSVar27;
  ulong uVar28;
  double dVar29;
  idx_t approved_tuple_count;
  optional_ptr<duckdb::AdaptiveFilter,_true> adaptive_filter;
  PrefetchState prefetch_state;
  optional_ptr<duckdb::DuckTransaction,_true> in_stack_fffffffffffffec8;
  undefined1 local_108 [48];
  vector<duckdb::StorageIndex,_true> *local_d8;
  ScanFilterInfo *local_d0;
  SelectionVector local_c8;
  DuckTransactionManager *local_a8;
  _Head_base<0UL,_duckdb::AdaptiveFilter_*,_false> local_a0;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_98;
  _Head_base<0UL,_duckdb::UndoBufferEntry_*,_false> local_90;
  optional_ptr<duckdb::UndoBufferEntry,_true> local_88;
  _Head_base<0UL,_duckdb::LocalStorage_*,_false> local_80;
  undefined1 local_78 [64];
  __node_base local_38;
  
  pTVar2 = state->parent;
  local_d8 = &pTVar2->column_ids;
  local_d0 = &pTVar2->filters;
  local_90._M_head_impl = (UndoBufferEntry *)&state->random;
  local_80._M_head_impl = (LocalStorage *)&(pTVar2->filters).filter_list;
  local_88.ptr = (UndoBufferEntry *)0xffffffffffffffff;
  local_108._8_8_ = this;
  local_108._16_8_ = result;
  local_108._40_8_ = state;
  do {
    iVar3 = state->vector_index;
    uVar28 = iVar3 * 0x800;
    local_108._24_8_ = state->max_row_group_row + iVar3 * -0x800;
    if (state->max_row_group_row < uVar28 ||
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_108._24_8_ ==
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      return;
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x7ff < (ulong)local_108._24_8_) {
      local_108._24_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x800;
    }
    if (((state->parent->sampling_info).do_system_sample != true) ||
       (dVar29 = RandomEngine::NextRandom((RandomEngine *)local_90._M_head_impl),
       pdVar1 = &(state->parent->sampling_info).sample_rate, dVar29 < *pdVar1 || dVar29 == *pdVar1))
    {
      bVar12 = CheckZonemapSegments((RowGroup *)local_108._8_8_,state);
      iVar14 = 2;
      if (bVar12) {
        pBVar4 = ((reference<RowGroupCollection> *)(local_108._8_8_ + 0x20))->_M_data->block_manager
        ;
        iVar14 = (*pBVar4->_vptr_BlockManager[0x12])();
        if ((char)iVar14 != '\0') {
          local_78._0_8_ = (StorageLockKey *)0x0;
          local_78._8_8_ = (pointer)0x0;
          local_78._16_8_ = (pointer)0x0;
          if ((pTVar2->column_ids).
              super_vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>.
              super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>.
              _M_impl.super__Vector_impl_data._M_finish !=
              (pTVar2->column_ids).
              super_vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>.
              super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>.
              _M_impl.super__Vector_impl_data._M_start) {
            lVar25 = 0;
            sVar26 = 0;
            do {
              pvVar15 = vector<duckdb::StorageIndex,_true>::operator[](local_d8,sVar26);
              if (pvVar15->index != 0xffffffffffffffff) {
                pCVar16 = GetColumn((RowGroup *)local_108._8_8_,pvVar15->index);
                (*pCVar16->_vptr_ColumnData[6])
                          (pCVar16,local_78,
                           (long)&((state->column_scans).
                                   super_unique_ptr<duckdb::ColumnScanState[],_std::default_delete<duckdb::ColumnScanState[]>_>
                                   ._M_t.
                                   super___uniq_ptr_impl<duckdb::ColumnScanState,_std::default_delete<duckdb::ColumnScanState[]>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_duckdb::ColumnScanState_*,_std::default_delete<duckdb::ColumnScanState[]>_>
                                   .super__Head_base<0UL,_duckdb::ColumnScanState_*,_false>.
                                  _M_head_impl)->current + lVar25,local_108._24_8_);
              }
              sVar26 = sVar26 + 1;
              lVar25 = lVar25 + 0x98;
            } while (sVar26 < (ulong)((long)(pTVar2->column_ids).
                                            super_vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>
                                            .
                                            super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)(pTVar2->column_ids).
                                            super_vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>
                                            .
                                            super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>
                                            ._M_impl.super__Vector_impl_data._M_start >> 5));
          }
          pBVar5 = pBVar4->buffer_manager;
          (*pBVar5->_vptr_BufferManager[8])(pBVar5,(PrefetchState *)local_78);
          PrefetchState::~PrefetchState((PrefetchState *)local_78);
        }
        if ((local_d0->table_filters).ptr == (TableFilterSet *)0x0) {
          local_108._36_4_ = 0;
        }
        else {
          uVar17 = ((long)(pTVar2->filters).filter_list.
                          super_vector<duckdb::ScanFilter,_std::allocator<duckdb::ScanFilter>_>.
                          super__Vector_base<duckdb::ScanFilter,_std::allocator<duckdb::ScanFilter>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(pTVar2->filters).filter_list.
                          super_vector<duckdb::ScanFilter,_std::allocator<duckdb::ScanFilter>_>.
                          super__Vector_base<duckdb::ScanFilter,_std::allocator<duckdb::ScanFilter>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x3333333333333333;
          local_108._36_4_ =
               (undefined4)
               CONCAT71((int7)(uVar17 >> 8),(pTVar2->filters).always_true_filters < uVar17);
        }
        if ((char)local_108._36_4_ == '\0') {
          if ((pTVar2->column_ids).
              super_vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>.
              super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>.
              _M_impl.super__Vector_impl_data._M_finish !=
              (pTVar2->column_ids).
              super_vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>.
              super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>.
              _M_impl.super__Vector_impl_data._M_start) {
            lVar25 = 0;
            sVar26 = 0;
            do {
              pvVar15 = vector<duckdb::StorageIndex,_true>::operator[](local_d8,sVar26);
              if (pvVar15->index == 0xffffffffffffffff) {
                pvVar20 = vector<duckdb::Vector,_true>::operator[]
                                    ((vector<duckdb::Vector,_true> *)local_108._16_8_,sVar26);
                Vector::Sequence(pvVar20,((SegmentBase<duckdb::RowGroup> *)local_108._8_8_)->start +
                                         uVar28,1,local_108._24_8_);
              }
              else {
                pCVar16 = GetColumn((RowGroup *)local_108._8_8_,pvVar15->index);
                iVar3 = *(idx_t *)(local_108._40_8_ + 8);
                _Var8._M_head_impl =
                     (((unsafe_unique_array<ColumnScanState> *)(local_108._40_8_ + 0x18))->
                     super_unique_ptr<duckdb::ColumnScanState[],_std::default_delete<duckdb::ColumnScanState[]>_>
                     )._M_t.
                     super___uniq_ptr_impl<duckdb::ColumnScanState,_std::default_delete<duckdb::ColumnScanState[]>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_duckdb::ColumnScanState_*,_std::default_delete<duckdb::ColumnScanState[]>_>
                     .super__Head_base<0UL,_duckdb::ColumnScanState_*,_false>._M_head_impl;
                pvVar20 = vector<duckdb::Vector,_true>::operator[]
                                    ((vector<duckdb::Vector,_true> *)local_108._16_8_,sVar26);
                uVar17 = (pCVar16->count).super___atomic_base<unsigned_long>._M_i + iVar3 * -0x800;
                if (0x7ff < uVar17) {
                  uVar17 = 0x800;
                }
                (*pCVar16->_vptr_ColumnData[10])
                          (pCVar16,iVar3,(long)&(_Var8._M_head_impl)->current + lVar25,pvVar20,0,
                           uVar17);
              }
              sVar26 = sVar26 + 1;
              lVar25 = lVar25 + 0x98;
              state = (CollectionScanState *)local_108._40_8_;
            } while (sVar26 < (ulong)((long)(pTVar2->column_ids).
                                            super_vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>
                                            .
                                            super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)(pTVar2->column_ids).
                                            super_vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>
                                            .
                                            super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>
                                            ._M_impl.super__Vector_impl_data._M_start >> 5));
          }
        }
        else {
          local_108._0_8_ = local_108._24_8_;
          local_c8.selection_data.internal.
          super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x0;
          local_c8.selection_data.internal.
          super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_c8.sel_vector = (sel_t *)0x0;
          local_a0._M_head_impl =
               (pTVar2->filters).adaptive_filter.
               super_unique_ptr<duckdb::AdaptiveFilter,_std::default_delete<duckdb::AdaptiveFilter>_>
               ._M_t.
               super___uniq_ptr_impl<duckdb::AdaptiveFilter,_std::default_delete<duckdb::AdaptiveFilter>_>
               ._M_t.
               super__Tuple_impl<0UL,_duckdb::AdaptiveFilter_*,_std::default_delete<duckdb::AdaptiveFilter>_>
               .super__Head_base<0UL,_duckdb::AdaptiveFilter_*,_false>._M_head_impl;
          local_98.__d.__r = (duration)ScanFilterInfo::BeginFilter(local_d0);
          if (local_108[0x24] != '\0') {
            pSVar22 = (pTVar2->filters).filter_list.
                      super_vector<duckdb::ScanFilter,_std::allocator<duckdb::ScanFilter>_>.
                      super__Vector_base<duckdb::ScanFilter,_std::allocator<duckdb::ScanFilter>_>.
                      _M_impl.super__Vector_impl_data._M_start;
            pSVar27 = (pTVar2->filters).filter_list.
                      super_vector<duckdb::ScanFilter,_std::allocator<duckdb::ScanFilter>_>.
                      super__Vector_base<duckdb::ScanFilter,_std::allocator<duckdb::ScanFilter>_>.
                      _M_impl.super__Vector_impl_data._M_finish;
            if (pSVar27 != pSVar22) {
              __n_00 = 0;
              do {
                optional_ptr<duckdb::AdaptiveFilter,_true>::CheckValid
                          ((optional_ptr<duckdb::AdaptiveFilter,_true> *)&local_a0);
                pvVar18 = vector<unsigned_long,_true>::operator[]
                                    (&(local_a0._M_head_impl)->permutation,__n_00);
                pvVar19 = vector<duckdb::ScanFilter,_true>::operator[]
                                    ((vector<duckdb::ScanFilter,_true> *)local_80._M_head_impl,
                                     *pvVar18);
                if (pvVar19->always_true == false) {
                  local_a8 = (DuckTransactionManager *)
                             unique_ptr<duckdb::TableFilterState,_std::default_delete<duckdb::TableFilterState>,_true>
                             ::operator*(&pvVar19->filter_state);
                  __n = pvVar19->scan_column_index;
                  pUVar6 = (UndoBufferEntry *)pvVar19->table_column_index;
                  pvVar20 = vector<duckdb::Vector,_true>::operator[]
                                      ((vector<duckdb::Vector,_true> *)local_108._16_8_,__n);
                  if (pUVar6 == local_88.ptr) {
                    iVar7 = ((SegmentBase<duckdb::RowGroup> *)local_108._8_8_)->start;
                    FVar13 = CheckRowIdFilter(pvVar19->filter,iVar7 + uVar28,
                                              (long)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>
                                                       *)(local_108._24_8_ + iVar3 * 0x80 * 0x10))->
                                                     _vptr__Sp_counted_base + iVar7);
                    state = (CollectionScanState *)local_108._40_8_;
                    if (FVar13 == FILTER_ALWAYS_FALSE) {
                      local_108._0_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                    }
                    else {
                      Vector::SetVectorType(pvVar20,FLAT_VECTOR);
                      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_108._0_8_ !=
                          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                        pdVar9 = pvVar20->data;
                        p_Var21 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                        do {
                          p_Var24 = p_Var21;
                          p_Var23 = p_Var21;
                          if (local_c8.sel_vector != (sel_t *)0x0) {
                            p_Var23 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                      (ulong)local_c8.sel_vector[(long)p_Var21];
                            p_Var24 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                      (ulong)local_c8.sel_vector[(long)p_Var21];
                          }
                          *(idx_t *)(pdVar9 + (long)p_Var24 * 8) =
                               (long)&p_Var23[iVar3 * 0x80]._vptr__Sp_counted_base +
                               ((SegmentBase<duckdb::RowGroup> *)local_108._8_8_)->start;
                          p_Var21 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                    ((long)&p_Var21->_vptr__Sp_counted_base + 1);
                        } while (p_Var21 < (ulong)local_108._0_8_);
                      }
                      if (FVar13 != FILTER_ALWAYS_TRUE) {
                        UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_78);
                        Vector::ToUnifiedFormat
                                  (pvVar20,local_108._0_8_,(UnifiedVectorFormat *)local_78);
                        in_stack_fffffffffffffec8.ptr = (DuckTransaction *)local_108;
                        ColumnSegment::FilterSelection
                                  (&local_c8,pvVar20,(UnifiedVectorFormat *)local_78,pvVar19->filter
                                   ,(TableFilterState *)local_a8,local_108._0_8_,
                                   (idx_t *)in_stack_fffffffffffffec8.ptr);
                        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38._M_nxt !=
                            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38._M_nxt
                                    );
                        }
                        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._32_8_ !=
                            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._32_8_
                                    );
                        }
                      }
                    }
                  }
                  else {
                    pCVar16 = GetColumn((RowGroup *)local_108._8_8_,pvVar19->table_column_index);
                    state = (CollectionScanState *)local_108._40_8_;
                    in_stack_fffffffffffffec8.ptr = transaction.transaction.ptr;
                    (*pCVar16->_vptr_ColumnData[0xd])
                              (pCVar16,*(idx_t *)(local_108._40_8_ + 8),
                               (((unsafe_unique_array<ColumnScanState> *)(local_108._40_8_ + 0x18))
                               ->
                               super_unique_ptr<duckdb::ColumnScanState[],_std::default_delete<duckdb::ColumnScanState[]>_>
                               )._M_t.
                               super___uniq_ptr_impl<duckdb::ColumnScanState,_std::default_delete<duckdb::ColumnScanState[]>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_duckdb::ColumnScanState_*,_std::default_delete<duckdb::ColumnScanState[]>_>
                               .super__Head_base<0UL,_duckdb::ColumnScanState_*,_false>._M_head_impl
                               + __n,pvVar20,&local_c8,local_108,transaction.transaction.ptr,
                               transaction.transaction_id,transaction.start_time,pvVar19->filter,
                               local_a8);
                  }
                }
                __n_00 = __n_00 + 1;
                pSVar22 = (pTVar2->filters).filter_list.
                          super_vector<duckdb::ScanFilter,_std::allocator<duckdb::ScanFilter>_>.
                          super__Vector_base<duckdb::ScanFilter,_std::allocator<duckdb::ScanFilter>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                pSVar27 = (pTVar2->filters).filter_list.
                          super_vector<duckdb::ScanFilter,_std::allocator<duckdb::ScanFilter>_>.
                          super__Vector_base<duckdb::ScanFilter,_std::allocator<duckdb::ScanFilter>_>
                          ._M_impl.super__Vector_impl_data._M_finish;
              } while (__n_00 < (ulong)(((long)pSVar27 - (long)pSVar22 >> 3) * -0x3333333333333333))
              ;
            }
            for (; pSVar22 != pSVar27; pSVar22 = pSVar22 + 1) {
              if (pSVar22->always_true == false) {
                pvVar20 = vector<duckdb::Vector,_true>::operator[]
                                    ((vector<duckdb::Vector,_true> *)local_108._16_8_,
                                     pSVar22->scan_column_index);
                Vector::Slice(pvVar20,&local_c8,local_108._0_8_);
              }
            }
          }
          uVar11 = local_108._0_8_;
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_108._0_8_ ==
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            DataChunk::Reset((DataChunk *)local_108._16_8_);
            p_Var21 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_108._24_8_;
            if ((pTVar2->column_ids).
                super_vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>.
                super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>.
                _M_impl.super__Vector_impl_data._M_finish !=
                (pTVar2->column_ids).
                super_vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>.
                super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>.
                _M_impl.super__Vector_impl_data._M_start) {
              lVar25 = 0;
              uVar28 = 0;
              do {
                pvVar15 = vector<duckdb::StorageIndex,_true>::operator[](local_d8,uVar28);
                if (pvVar15->index != 0xffffffffffffffff) {
                  if ((local_108[0x24] != '\0') &&
                     (lVar10 = (long)(pTVar2->filters).column_has_filter.
                                     super_vector<bool,_std::allocator<bool>_>.
                                     super__Bvector_base<std::allocator<bool>_>._M_impl.
                                     super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                     , uVar28 < (ulong)(pTVar2->filters).column_has_filter.
                                       super_vector<bool,_std::allocator<bool>_>.
                                       super__Bvector_base<std::allocator<bool>_>._M_impl.
                                       super__Bvector_impl_data._M_finish.super__Bit_iterator_base.
                                       _M_offset +
                                ((long)(pTVar2->filters).column_has_filter.
                                       super_vector<bool,_std::allocator<bool>_>.
                                       super__Bvector_base<std::allocator<bool>_>._M_impl.
                                       super__Bvector_impl_data._M_finish.super__Bit_iterator_base.
                                       _M_p - lVar10) * 8)) {
                    uVar17 = uVar28 + 0x3f;
                    if (-1 < (long)uVar28) {
                      uVar17 = uVar28;
                    }
                    if ((*(ulong *)(lVar10 + ((long)uVar17 >> 6) * 8 + -8 +
                                   (ulong)((uVar28 & 0x800000000000003f) < 0x8000000000000001) * 8)
                         >> (uVar28 & 0x3f) & 1) != 0) goto LAB_017d2f5b;
                  }
                  pCVar16 = GetColumn((RowGroup *)local_108._8_8_,pvVar15->index);
                  (*pCVar16->_vptr_ColumnData[0x10])
                            (pCVar16,(long)&((state->column_scans).
                                             super_unique_ptr<duckdb::ColumnScanState[],_std::default_delete<duckdb::ColumnScanState[]>_>
                                             ._M_t.
                                             super___uniq_ptr_impl<duckdb::ColumnScanState,_std::default_delete<duckdb::ColumnScanState[]>_>
                                             ._M_t.
                                             super__Tuple_impl<0UL,_duckdb::ColumnScanState_*,_std::default_delete<duckdb::ColumnScanState[]>_>
                                             .
                                             super__Head_base<0UL,_duckdb::ColumnScanState_*,_false>
                                            ._M_head_impl)->current + lVar25,0x800);
                }
LAB_017d2f5b:
                uVar28 = uVar28 + 1;
                lVar25 = lVar25 + 0x98;
              } while (uVar28 < (ulong)((long)(pTVar2->column_ids).
                                              super_vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>
                                              .
                                              super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>
                                              ._M_impl.super__Vector_impl_data._M_finish -
                                        (long)(pTVar2->column_ids).
                                              super_vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>
                                              .
                                              super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>
                                              ._M_impl.super__Vector_impl_data._M_start >> 5));
            }
            state->vector_index = state->vector_index + 1;
            iVar14 = 2;
          }
          else {
            if ((pTVar2->column_ids).
                super_vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>.
                super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>.
                _M_impl.super__Vector_impl_data._M_finish !=
                (pTVar2->column_ids).
                super_vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>.
                super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>.
                _M_impl.super__Vector_impl_data._M_start) {
              uVar28 = 0;
              do {
                if ((local_108[0x24] == '\0') ||
                   (lVar25 = (long)(pTVar2->filters).column_has_filter.
                                   super_vector<bool,_std::allocator<bool>_>.
                                   super__Bvector_base<std::allocator<bool>_>._M_impl.
                                   super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                   (ulong)(pTVar2->filters).column_has_filter.
                          super_vector<bool,_std::allocator<bool>_>.
                          super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset +
                   ((long)(pTVar2->filters).column_has_filter.
                          super_vector<bool,_std::allocator<bool>_>.
                          super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p - lVar25)
                   * 8 <= uVar28)) {
LAB_017d2c8d:
                  pvVar15 = vector<duckdb::StorageIndex,_true>::operator[](local_d8,uVar28);
                  if (pvVar15->index == 0xffffffffffffffff) {
                    pvVar20 = vector<duckdb::Vector,_true>::operator[]
                                        ((vector<duckdb::Vector,_true> *)local_108._16_8_,uVar28);
                    Vector::SetVectorType(pvVar20,FLAT_VECTOR);
                    pvVar20 = vector<duckdb::Vector,_true>::operator[]
                                        ((vector<duckdb::Vector,_true> *)local_108._16_8_,uVar28);
                    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_108._0_8_ !=
                        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                      pdVar9 = pvVar20->data;
                      p_Var21 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                      do {
                        p_Var23 = p_Var21;
                        if (local_c8.sel_vector != (sel_t *)0x0) {
                          p_Var23 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                    (ulong)local_c8.sel_vector[(long)p_Var21];
                        }
                        *(idx_t *)(pdVar9 + (long)p_Var21 * 8) =
                             (long)&p_Var23[iVar3 * 0x80]._vptr__Sp_counted_base +
                             ((SegmentBase<duckdb::RowGroup> *)local_108._8_8_)->start;
                        p_Var21 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                  ((long)&p_Var21->_vptr__Sp_counted_base + 1);
                      } while (p_Var21 < (ulong)local_108._0_8_);
                    }
                  }
                  else {
                    pCVar16 = GetColumn((RowGroup *)local_108._8_8_,pvVar15->index);
                    iVar7 = *(idx_t *)(local_108._40_8_ + 8);
                    _Var8._M_head_impl =
                         (((unsafe_unique_array<ColumnScanState> *)(local_108._40_8_ + 0x18))->
                         super_unique_ptr<duckdb::ColumnScanState[],_std::default_delete<duckdb::ColumnScanState[]>_>
                         )._M_t.
                         super___uniq_ptr_impl<duckdb::ColumnScanState,_std::default_delete<duckdb::ColumnScanState[]>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_duckdb::ColumnScanState_*,_std::default_delete<duckdb::ColumnScanState[]>_>
                         .super__Head_base<0UL,_duckdb::ColumnScanState_*,_false>._M_head_impl;
                    pvVar20 = vector<duckdb::Vector,_true>::operator[]
                                        ((vector<duckdb::Vector,_true> *)local_108._16_8_,uVar28);
                    in_stack_fffffffffffffec8.ptr =
                         in_stack_fffffffffffffec8.ptr & 0xffffffff00000000;
                    (*pCVar16->_vptr_ColumnData[0xf])
                              (pCVar16,iVar7,_Var8._M_head_impl + uVar28,pvVar20,&local_c8,
                               local_108._0_8_,in_stack_fffffffffffffec8.ptr);
                  }
                }
                else {
                  uVar17 = uVar28 + 0x3f;
                  if (-1 < (long)uVar28) {
                    uVar17 = uVar28;
                  }
                  if ((*(ulong *)(lVar25 + ((long)uVar17 >> 6) * 8 + -8 +
                                 (ulong)((uVar28 & 0x800000000000003f) < 0x8000000000000001) * 8) >>
                       (uVar28 & 0x3f) & 1) == 0) goto LAB_017d2c8d;
                }
                uVar28 = uVar28 + 1;
              } while (uVar28 < (ulong)((long)(pTVar2->column_ids).
                                              super_vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>
                                              .
                                              super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>
                                              ._M_impl.super__Vector_impl_data._M_finish -
                                        (long)(pTVar2->column_ids).
                                              super_vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>
                                              .
                                              super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>
                                              ._M_impl.super__Vector_impl_data._M_start >> 5));
            }
            ScanFilterInfo::EndFilter(local_d0,(AdaptiveFilterState)local_98.__d.__r);
            iVar14 = 0;
            state = (CollectionScanState *)local_108._40_8_;
            p_Var21 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_108._0_8_;
          }
          local_108._24_8_ = p_Var21;
          if (local_c8.selection_data.internal.
              super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_c8.selection_data.internal.
                       super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar11 ==
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) goto LAB_017d2fc1;
        }
        (((shared_ptr<duckdb::DatabaseInstance,_true> *)(local_108._16_8_ + 0x10))->internal).
        super___shared_ptr<duckdb::DatabaseInstance,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_108._24_8_;
        state->vector_index = state->vector_index + 1;
        iVar14 = 3;
      }
    }
    else {
      NextVector((RowGroup *)local_108._8_8_,state);
      iVar14 = 2;
    }
LAB_017d2fc1:
    if (iVar14 != 2) {
      return;
    }
  } while( true );
}

Assistant:

void RowGroup::TemplatedScan(TransactionData transaction, CollectionScanState &state, DataChunk &result) {
	const bool ALLOW_UPDATES = TYPE != TableScanType::TABLE_SCAN_COMMITTED_ROWS_DISALLOW_UPDATES &&
	                           TYPE != TableScanType::TABLE_SCAN_COMMITTED_ROWS_OMIT_PERMANENTLY_DELETED;
	const auto &column_ids = state.GetColumnIds();
	auto &filter_info = state.GetFilterInfo();
	while (true) {
		if (state.vector_index * STANDARD_VECTOR_SIZE >= state.max_row_group_row) {
			// exceeded the amount of rows to scan
			return;
		}
		idx_t current_row = state.vector_index * STANDARD_VECTOR_SIZE;
		auto max_count = MinValue<idx_t>(STANDARD_VECTOR_SIZE, state.max_row_group_row - current_row);

		// check the sampling info if we have to sample this chunk
		if (state.GetSamplingInfo().do_system_sample &&
		    state.random.NextRandom() > state.GetSamplingInfo().sample_rate) {
			NextVector(state);
			continue;
		}

		//! first check the zonemap if we have to scan this partition
		if (!CheckZonemapSegments(state)) {
			continue;
		}

		// second, scan the version chunk manager to figure out which tuples to load for this transaction
		idx_t count;
		if (TYPE == TableScanType::TABLE_SCAN_REGULAR) {
			count = state.row_group->GetSelVector(transaction, state.vector_index, state.valid_sel, max_count);
			if (count == 0) {
				// nothing to scan for this vector, skip the entire vector
				NextVector(state);
				continue;
			}
		} else if (TYPE == TableScanType::TABLE_SCAN_COMMITTED_ROWS_OMIT_PERMANENTLY_DELETED) {
			count = state.row_group->GetCommittedSelVector(transaction.start_time, transaction.transaction_id,
			                                               state.vector_index, state.valid_sel, max_count);
			if (count == 0) {
				// nothing to scan for this vector, skip the entire vector
				NextVector(state);
				continue;
			}
		} else {
			count = max_count;
		}
		auto &block_manager = GetBlockManager();
#ifndef DUCKDB_ALTERNATIVE_VERIFY
		// // in regular operation we only prefetch from remote file systems
		// // when alternative verify is set, we always prefetch for testing purposes
		if (block_manager.IsRemote())
#else
		if (!block_manager.InMemory())
#endif
		{
			PrefetchState prefetch_state;
			for (idx_t i = 0; i < column_ids.size(); i++) {
				const auto &column = column_ids[i];
				if (!column.IsRowIdColumn()) {
					GetColumn(column).InitializePrefetch(prefetch_state, state.column_scans[i], max_count);
				}
			}
			auto &buffer_manager = block_manager.buffer_manager;
			buffer_manager.Prefetch(prefetch_state.blocks);
		}

		bool has_filters = filter_info.HasFilters();
		if (count == max_count && !has_filters) {
			// scan all vectors completely: full scan without deletions or table filters
			for (idx_t i = 0; i < column_ids.size(); i++) {
				const auto &column = column_ids[i];
				if (column.IsRowIdColumn()) {
					// scan row id
					D_ASSERT(result.data[i].GetType().InternalType() == ROW_TYPE);
					result.data[i].Sequence(UnsafeNumericCast<int64_t>(this->start + current_row), 1, count);
				} else {
					auto &col_data = GetColumn(column);
					if (TYPE != TableScanType::TABLE_SCAN_REGULAR) {
						col_data.ScanCommitted(state.vector_index, state.column_scans[i], result.data[i],
						                       ALLOW_UPDATES);
					} else {
						col_data.Scan(transaction, state.vector_index, state.column_scans[i], result.data[i]);
					}
				}
			}
		} else {
			// partial scan: we have deletions or table filters
			idx_t approved_tuple_count = count;
			SelectionVector sel;
			if (count != max_count) {
				sel.Initialize(state.valid_sel);
			} else {
				sel.Initialize(nullptr);
			}
			//! first, we scan the columns with filters, fetch their data and generate a selection vector.
			//! get runtime statistics
			auto adaptive_filter = filter_info.GetAdaptiveFilter();
			auto filter_state = filter_info.BeginFilter();
			if (has_filters) {
				D_ASSERT(ALLOW_UPDATES);
				auto &filter_list = filter_info.GetFilterList();
				for (idx_t i = 0; i < filter_list.size(); i++) {
					auto filter_idx = adaptive_filter->permutation[i];
					auto &filter = filter_list[filter_idx];
					if (filter.IsAlwaysTrue()) {
						// this filter is always true - skip it
						continue;
					}
					auto &table_filter_state = *filter.filter_state;

					const auto scan_idx = filter.scan_column_index;
					const auto column_idx = filter.table_column_index;

					auto &result_vector = result.data[scan_idx];
					if (column_idx == COLUMN_IDENTIFIER_ROW_ID) {
						// We do another quick statistics scan for row ids here
						const auto rowid_start = this->start + current_row;
						const auto rowid_end = this->start + current_row + max_count;
						const auto prune_result = CheckRowIdFilter(filter.filter, rowid_start, rowid_end);
						if (prune_result == FilterPropagateResult::FILTER_ALWAYS_FALSE) {
							// We can just break out of the loop here.
							approved_tuple_count = 0;
							continue;
						}

						// Generate row ids
						// Create sequence for row ids
						D_ASSERT(result_vector.GetType().InternalType() == ROW_TYPE);
						result_vector.SetVectorType(VectorType::FLAT_VECTOR);
						auto result_data = FlatVector::GetData<int64_t>(result_vector);
						for (size_t sel_idx = 0; sel_idx < approved_tuple_count; sel_idx++) {
							result_data[sel.get_index(sel_idx)] =
							    UnsafeNumericCast<int64_t>(this->start + current_row + sel.get_index(sel_idx));
						}

						// Was this filter always true? If so, we dont need to apply it
						if (prune_result == FilterPropagateResult::FILTER_ALWAYS_TRUE) {
							continue;
						}

						// Now apply the filter
						UnifiedVectorFormat vdata;
						result_vector.ToUnifiedFormat(approved_tuple_count, vdata);
						ColumnSegment::FilterSelection(sel, result_vector, vdata, filter.filter, table_filter_state,
						                               approved_tuple_count, approved_tuple_count);

					} else {
						auto &col_data = GetColumn(filter.table_column_index);
						col_data.Filter(transaction, state.vector_index, state.column_scans[scan_idx], result_vector,
						                sel, approved_tuple_count, filter.filter, table_filter_state);
					}
				}
				for (auto &table_filter : filter_list) {
					if (table_filter.IsAlwaysTrue()) {
						continue;
					}
					result.data[table_filter.scan_column_index].Slice(sel, approved_tuple_count);
				}
			}
			if (approved_tuple_count == 0) {
				// all rows were filtered out by the table filters
				D_ASSERT(has_filters);
				result.Reset();
				// skip this vector in all the scans that were not scanned yet
				for (idx_t i = 0; i < column_ids.size(); i++) {
					auto &col_idx = column_ids[i];
					if (col_idx.IsRowIdColumn()) {
						continue;
					}
					if (has_filters && filter_info.ColumnHasFilters(i)) {
						continue;
					}
					auto &col_data = GetColumn(col_idx);
					col_data.Skip(state.column_scans[i]);
				}
				state.vector_index++;
				continue;
			}
			//! Now we use the selection vector to fetch data for the other columns.
			for (idx_t i = 0; i < column_ids.size(); i++) {
				if (has_filters && filter_info.ColumnHasFilters(i)) {
					// column has already been scanned as part of the filtering process
					continue;
				}
				auto &column = column_ids[i];
				if (column.IsRowIdColumn()) {
					D_ASSERT(result.data[i].GetType().InternalType() == ROW_TYPE);
					result.data[i].SetVectorType(VectorType::FLAT_VECTOR);
					auto result_data = FlatVector::GetData<int64_t>(result.data[i]);
					for (size_t sel_idx = 0; sel_idx < approved_tuple_count; sel_idx++) {
						result_data[sel_idx] =
						    UnsafeNumericCast<int64_t>(this->start + current_row + sel.get_index(sel_idx));
					}
				} else {
					auto &col_data = GetColumn(column);
					if (TYPE == TableScanType::TABLE_SCAN_REGULAR) {
						col_data.Select(transaction, state.vector_index, state.column_scans[i], result.data[i], sel,
						                approved_tuple_count);
					} else {
						col_data.SelectCommitted(state.vector_index, state.column_scans[i], result.data[i], sel,
						                         approved_tuple_count, ALLOW_UPDATES);
					}
				}
			}
			filter_info.EndFilter(filter_state);

			D_ASSERT(approved_tuple_count > 0);
			count = approved_tuple_count;
		}
		result.SetCardinality(count);
		state.vector_index++;
		break;
	}
}